

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileString.cpp
# Opt level: O1

void __thiscall
Js::StringProfiler::StringProfiler(StringProfiler *this,PageAllocator *pageAllocator)

{
  ThreadContextId pvVar1;
  
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)this,
             L"StringProfiler",pageAllocator,Throw::OutOfMemory,
             JsUtil::ExternalApi::RecoverUnusedMemory);
  pvVar1 = JsUtil::ExternalApi::GetCurrentThreadContextId();
  this->mainThreadId = pvVar1;
  (this->stringLengthMetrics).buckets = (Type)0x0;
  (this->stringLengthMetrics).entries = (Type)0x0;
  this->discardedWrongThread = 0;
  this->embeddedNULChars = 0;
  this->embeddedNULStrings = 0;
  this->emptyStrings = 0;
  this->singleCharStrings = 0;
  (this->stringLengthMetrics).alloc = &this->allocator;
  (this->stringLengthMetrics).size = 0;
  (this->stringLengthMetrics).bucketCount = 0;
  (this->stringLengthMetrics).count = 0;
  (this->stringLengthMetrics).freeCount = 0;
  (this->stringLengthMetrics).modFunctionIndex = 0x4b;
  (this->stringLengthMetrics).stats = (Type)0x0;
  (this->stringConcatMetrics).buckets = (Type)0x0;
  (this->stringConcatMetrics).entries = (Type)0x0;
  (this->stringConcatMetrics).alloc = &this->allocator;
  (this->stringConcatMetrics).size = 0;
  (this->stringConcatMetrics).bucketCount = 0;
  (this->stringConcatMetrics).count = 0;
  (this->stringConcatMetrics).freeCount = 0;
  (this->stringConcatMetrics).modFunctionIndex = 0x4b;
  (this->stringConcatMetrics).stats = (Type)0x0;
  JsUtil::
  BaseDictionary<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Initialize(&this->stringConcatMetrics,0x2b);
  return;
}

Assistant:

StringProfiler::StringProfiler(PageAllocator * pageAllocator)
      : allocator(_u("StringProfiler"), pageAllocator, Throw::OutOfMemory ),
        mainThreadId(GetCurrentThreadContextId() ),
        discardedWrongThread(0),
        stringLengthMetrics(&allocator),
        embeddedNULChars(0),
        embeddedNULStrings(0),
        emptyStrings(0),
        singleCharStrings(0),
        stringConcatMetrics(&allocator, 43)
    {
    }